

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep.c
# Opt level: O3

void rep0_ctx_send(void *arg,nni_aio *aio)

{
  uint uVar1;
  nni_mtx *mtx;
  _Bool _Var2;
  nng_err result;
  nni_msg *m;
  undefined8 *puVar3;
  size_t sVar4;
  
  mtx = *arg;
  m = nni_aio_get_msg(aio);
  nni_msg_header_clear(m);
  nni_mtx_lock(mtx);
  sVar4 = *(size_t *)((long)arg + 0x48);
  uVar1 = *(uint *)((long)arg + 8);
  *(undefined8 *)((long)arg + 0x48) = 0;
  *(undefined4 *)((long)arg + 8) = 0;
  if ((void *)((long)&mtx[3].mtx + 0x20) == arg) {
    nni_pollable_clear((nni_pollable *)&mtx[7].mtx.__data.__list.__next);
  }
  if (sVar4 == 0) {
    nni_mtx_unlock(mtx);
    result = NNG_ESTATE;
  }
  else {
    result = nni_msg_header_append(m,(void *)((long)arg + 0x50),sVar4);
    if (result == NNG_OK) {
      puVar3 = (undefined8 *)nni_id_get((nni_id_map *)((long)&mtx[1].mtx + 8),(ulong)uVar1);
      if (puVar3 == (undefined8 *)0x0) {
        nni_mtx_unlock(mtx);
        nni_aio_set_msg(aio,(nni_msg *)0x0);
        sVar4 = nni_msg_len(m);
        nni_aio_finish(aio,NNG_OK,sVar4);
        nni_msg_free(m);
        return;
      }
      if (*(char *)(puVar3 + 0x7a) != '\0') {
        _Var2 = nni_aio_start(aio,rep0_ctx_cancel_send,arg);
        if (_Var2) {
          *(nni_aio **)((long)arg + 0x18) = aio;
          *(undefined8 **)((long)arg + 0x10) = puVar3;
          nni_list_append((nni_list *)(puVar3 + 0x77),arg);
        }
        nni_mtx_unlock(mtx);
        return;
      }
      *(undefined1 *)(puVar3 + 0x7a) = 1;
      sVar4 = nni_msg_len(m);
      nni_aio_set_msg((nni_aio *)(puVar3 + 3),m);
      nni_pipe_send((nni_pipe *)*puVar3,(nni_aio *)(puVar3 + 3));
      nni_mtx_unlock(mtx);
      nni_aio_set_msg(aio,(nni_msg *)0x0);
      nni_aio_finish(aio,NNG_OK,sVar4);
      return;
    }
    nni_mtx_unlock(mtx);
  }
  nni_aio_finish_error(aio,result);
  return;
}

Assistant:

static void
rep0_ctx_send(void *arg, nni_aio *aio)
{
	rep0_ctx  *ctx = arg;
	rep0_sock *s   = ctx->sock;
	rep0_pipe *p;
	nni_msg   *msg;
	int        rv;
	size_t     len;
	uint32_t   p_id; // pipe id

	msg = nni_aio_get_msg(aio);
	nni_msg_header_clear(msg);

	nni_mtx_lock(&s->lk);
	len  = ctx->btrace_len;
	p_id = ctx->pipe_id;

	// Assert "completion" of the previous req request.  This ensures
	// exactly one send for one receive ordering.
	ctx->btrace_len = 0;
	ctx->pipe_id    = 0;

	if (ctx == &s->ctx) {
		// No matter how this goes, we will no longer be able
		// to send on the socket (root context).  That's because
		// we will have finished (successfully or otherwise) the
		// reply for the single request we got.
		nni_pollable_clear(&s->writable);
	}
	if (len == 0) {
		nni_mtx_unlock(&s->lk);
		nni_aio_finish_error(aio, NNG_ESTATE);
		return;
	}
	if ((rv = nni_msg_header_append(msg, ctx->btrace, len)) != 0) {
		nni_mtx_unlock(&s->lk);
		nni_aio_finish_error(aio, rv);
		return;
	}
	if ((p = nni_id_get(&s->pipes, p_id)) == NULL) {
		// Pipe is gone.  Make this look like a good send to avoid
		// disrupting the state machine.  We don't care if the peer
		// lost interest in our reply.
		nni_mtx_unlock(&s->lk);
		nni_aio_set_msg(aio, NULL);
		nni_aio_finish(aio, 0, nni_msg_len(msg));
		nni_msg_free(msg);
		return;
	}
	if (!p->busy) {
		p->busy = true;
		len     = nni_msg_len(msg);
		nni_aio_set_msg(&p->aio_send, msg);
		nni_pipe_send(p->pipe, &p->aio_send);
		nni_mtx_unlock(&s->lk);

		nni_aio_set_msg(aio, NULL);
		nni_aio_finish(aio, 0, len);
		return;
	}

	if (!nni_aio_start(aio, rep0_ctx_cancel_send, ctx)) {
		nni_mtx_unlock(&s->lk);
		return;
	}

	ctx->saio  = aio;
	ctx->spipe = p;
	nni_list_append(&p->sendq, ctx);
	nni_mtx_unlock(&s->lk);
}